

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::iterate(ClearTest *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  byte bVar3;
  int iVar4;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareFramebuffer(this,0x1800,0x8229);
    if ((int)this->m_renderbuffers_count < 1) {
      bVar3 = 1;
    }
    else {
      bVar3 = 1;
      iVar4 = 0;
      do {
        bVar1 = TestClearColor<float>(this,0x1800,iVar4 + 0x8ce0,0.5);
        bVar3 = bVar3 & bVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)this->m_renderbuffers_count);
    }
    Clean(this);
    PrepareFramebuffer(this,0x1800,0x822e);
    if (0 < (int)this->m_renderbuffers_count) {
      iVar4 = 0;
      do {
        bVar1 = TestClearColor<float>(this,0x1800,iVar4 + 0x8ce0,0.5);
        bVar3 = bVar3 & bVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)this->m_renderbuffers_count);
    }
    Clean(this);
    PrepareFramebuffer(this,0x1800,0x8231);
    if (0 < (int)this->m_renderbuffers_count) {
      iVar4 = 0;
      do {
        bVar1 = TestClearColor<int>(this,0x1800,iVar4 + 0x8ce0,-0x10);
        bVar3 = bVar3 & bVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)this->m_renderbuffers_count);
    }
    Clean(this);
    PrepareFramebuffer(this,0x1800,0x8232);
    if (0 < (int)this->m_renderbuffers_count) {
      iVar4 = 0;
      do {
        bVar1 = TestClearColor<unsigned_int>(this,0x1800,iVar4 + 0x8ce0,0x10);
        bVar3 = bVar3 & bVar1;
        iVar4 = iVar4 + 1;
      } while (iVar4 < (int)this->m_renderbuffers_count);
    }
    Clean(this);
    PrepareFramebuffer(this,0x84f9,0x88f0);
    bVar1 = TestClearDepthAndStencil(this,1.0,1);
    Clean(this);
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar3 & bVar1) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ClearTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Fixed point color test. */
		PrepareFramebuffer(GL_COLOR, GL_R8);

		for (glw::GLint i = 0; i < (glw::GLint)m_renderbuffers_count; ++i)
		{
			is_ok &= TestClearColor<glw::GLfloat>(GL_COLOR, GL_COLOR_ATTACHMENT0 + i, 0.5);
		}

		Clean();

		/* Floating point color test. */
		PrepareFramebuffer(GL_COLOR, GL_R32F);

		for (glw::GLint i = 0; i < (glw::GLint)m_renderbuffers_count; ++i)
		{
			is_ok &= TestClearColor<glw::GLfloat>(GL_COLOR, GL_COLOR_ATTACHMENT0 + i, 0.5);
		}

		Clean();

		/* Signed integer color test. */
		PrepareFramebuffer(GL_COLOR, GL_R8I);

		for (glw::GLint i = 0; i < (glw::GLint)m_renderbuffers_count; ++i)
		{
			is_ok &= TestClearColor<glw::GLint>(GL_COLOR, GL_COLOR_ATTACHMENT0 + i, -16);
		}

		Clean();

		/* Unsigned integer color test. */
		PrepareFramebuffer(GL_COLOR, GL_R8UI);

		for (glw::GLint i = 0; i < (glw::GLint)m_renderbuffers_count; ++i)
		{
			is_ok &= TestClearColor<glw::GLuint>(GL_COLOR, GL_COLOR_ATTACHMENT0 + i, 16);
		}

		Clean();

		/* Depth / stencil test. */
		PrepareFramebuffer(GL_DEPTH_STENCIL, GL_DEPTH24_STENCIL8);

		is_ok &= TestClearDepthAndStencil(1, 1);

		Clean();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}